

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_manager.cpp
# Opt level: O0

void __thiscall EmmyDebuggerManager::HandleBreak(EmmyDebuggerManager *this,lua_State *L)

{
  bool bVar1;
  element_type *peVar2;
  shared_ptr<Debugger> local_58;
  undefined1 local_48 [32];
  shared_ptr<Debugger> debugger;
  lua_State *L_local;
  EmmyDebuggerManager *this_local;
  
  debugger.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)L;
  GetDebugger((EmmyDebuggerManager *)&stack0xffffffffffffffd8,(lua_State *)this);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffffd8);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &stack0xffffffffffffffd8);
    Debugger::SetCurrentState
              (peVar2,(lua_State *)
                      debugger.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi);
  }
  else {
    AddDebugger((EmmyDebuggerManager *)local_48,(lua_State *)this);
    std::shared_ptr<Debugger>::operator=
              ((shared_ptr<Debugger> *)&stack0xffffffffffffffd8,(shared_ptr<Debugger> *)local_48);
    std::shared_ptr<Debugger>::~shared_ptr((shared_ptr<Debugger> *)local_48);
  }
  std::shared_ptr<Debugger>::shared_ptr(&local_58,(shared_ptr<Debugger> *)&stack0xffffffffffffffd8);
  SetHitDebugger(this,&local_58);
  std::shared_ptr<Debugger>::~shared_ptr(&local_58);
  peVar2 = std::__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &stack0xffffffffffffffd8);
  Debugger::HandleBreak(peVar2);
  std::shared_ptr<Debugger>::~shared_ptr((shared_ptr<Debugger> *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

void EmmyDebuggerManager::HandleBreak(lua_State* L)
{
	auto debugger = GetDebugger(L);

	if (debugger)
	{
		debugger->SetCurrentState(L);
	}
	else
	{
		debugger = AddDebugger(L);
	}

	SetHitDebugger(debugger);

	debugger->HandleBreak();
}